

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool run_msgpack_example(void)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  bool bVar1;
  void *this_00;
  ostream *poVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *local_350;
  allocator<char> local_339;
  string local_338;
  sub_form local_318;
  number_validator<int> local_308;
  allocator<char> local_2f1;
  string local_2f0;
  sub_form local_2d0;
  boolean_validator local_2b9;
  byte local_2b8;
  int local_2b4;
  anon_struct_8_2_ceb62c99 mpack;
  form form;
  int local_278 [5];
  bool local_261;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_228;
  iterator local_1f8;
  size_type local_1f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_1e8;
  undefined1 local_1b8 [8];
  any var2;
  any var;
  stringstream ss;
  ostream local_188 [383];
  byte local_9;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&var._M_storage);
  std::any::any((any *)&var2._M_storage);
  std::any::any((any *)local_1b8);
  local_260 = &local_258;
  local_261 = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[8],_bool,_true>(local_260,(char (*) [8])"compact",&local_261);
  local_260 = &local_228;
  local_278[0] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_int,_true>(local_260,(char (*) [7])"schema",local_278);
  local_1f8 = &local_258;
  local_1f0 = 2;
  this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
          *)(form.error_.message_.field_2._M_local_buf + 0xe);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  ::allocator(this);
  __l._M_len = local_1f0;
  __l._M_array = local_1f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map(&local_1e8,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        (form.error_.message_.field_2._M_local_buf + 0xf),this);
  std::any::operator=((any *)&var2._M_storage,&local_1e8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~map(&local_1e8);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                *)(form.error_.message_.field_2._M_local_buf + 0xe));
  local_350 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
               *)&local_1f8;
  do {
    local_350 = local_350 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair(local_350);
  } while (local_350 != &local_258);
  goodform::msgpack::serialize((any *)&var2._M_storage,local_188);
  goodform::msgpack::deserialize((istream *)&var._M_storage,(any *)local_1b8);
  goodform::form::form((form *)&mpack,(any *)local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"compact",&local_2f1);
  local_2d0 = goodform::sub_form::at((sub_form *)&mpack,&local_2f0);
  local_2b9 = goodform::sub_form::boolean(&local_2d0);
  local_2b8 = goodform::boolean_validator::val(&local_2b9);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"schema",&local_339);
  local_318 = goodform::sub_form::at((sub_form *)&mpack,&local_338);
  goodform::sub_form::int32((sub_form *)&local_308);
  local_2b4 = goodform::number_validator<int>::val(&local_308);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar1 = goodform::form::is_good((form *)&mpack);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"{ \"compact\": ");
    this_00 = (void *)std::ostream::operator<<(poVar2,std::boolalpha);
    poVar2 = (ostream *)std::ostream::operator<<(this_00,(bool)(local_2b8 & 1));
    poVar2 = std::operator<<(poVar2,", \"schema\": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_2b4);
    poVar2 = std::operator<<(poVar2," }");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"MsgPack Passed.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"MsgPack Passed.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_9 = bVar1;
  goodform::form::~form((form *)&mpack);
  std::any::~any((any *)local_1b8);
  std::any::~any((any *)&var2._M_storage);
  std::__cxx11::stringstream::~stringstream((stringstream *)&var._M_storage);
  return (bool)(local_9 & 1);
}

Assistant:

bool run_msgpack_example()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"compact", true},
      {"schema", 0}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool compact;
    std::int32_t schema;
  } mpack;

  mpack.compact = form.at("compact").boolean().val();
  mpack.schema = form.at("schema").int32().val();

  if (form.is_good())
  {
    std::cout << "{ \"compact\": " << std::boolalpha << mpack.compact << ", \"schema\": " << mpack.schema << " }" << std::endl;
    std::cout << "MsgPack Passed." << std::endl;
    return true;
  }

  std::cerr << "MsgPack Passed." << std::endl;
  return false;
}